

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

bool __thiscall testing::TestResult::Skipped(TestResult *this)

{
  pointer pTVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined8 uVar4;
  byte bVar5;
  byte bVar6;
  long lVar7;
  bool bVar8;
  pointer pTVar9;
  ulong uVar10;
  ushort uVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  
  bVar8 = Failed(this);
  if (!bVar8) {
    pTVar9 = (this->test_part_results_).
             super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pTVar1 = (this->test_part_results_).
             super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pTVar9 != pTVar1) {
      auVar13 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar14 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      vpmovsxwd_avx512f(_DAT_0014d850);
      auVar15 = vpbroadcastd_avx512f(ZEXT416(3));
      auVar19 = ZEXT1664((undefined1  [16])0x0);
      lVar7 = -0x70 - (long)pTVar9;
      auVar16 = vpbroadcastq_avx512f();
      uVar10 = 0;
      do {
        auVar17 = vpbroadcastq_avx512f();
        auVar18 = vmovdqa64_avx512f(auVar19);
        uVar10 = uVar10 + 0x10;
        auVar19 = vporq_avx512f(auVar17,auVar13);
        auVar17 = vporq_avx512f(auVar17,auVar14);
        uVar4 = vpcmpuq_avx512f(auVar17,auVar16,2);
        bVar5 = (byte)uVar4;
        uVar4 = vpcmpuq_avx512f(auVar19,auVar16,2);
        bVar6 = (byte)uVar4;
        uVar11 = CONCAT11(bVar6,bVar5);
        auVar19 = vpgatherdd_avx512f(*(undefined4 *)
                                      ((long)&(this->test_properites_mutex_).super_MutexBase.mutex_
                                      + (long)&pTVar9->type_));
        auVar17._4_4_ = (uint)((byte)(uVar11 >> 1) & 1) * auVar19._4_4_;
        auVar17._0_4_ = (uint)(bVar5 & 1) * auVar19._0_4_;
        auVar17._8_4_ = (uint)((byte)(uVar11 >> 2) & 1) * auVar19._8_4_;
        auVar17._12_4_ = (uint)((byte)(uVar11 >> 3) & 1) * auVar19._12_4_;
        auVar17._16_4_ = (uint)((byte)(uVar11 >> 4) & 1) * auVar19._16_4_;
        auVar17._20_4_ = (uint)((byte)(uVar11 >> 5) & 1) * auVar19._20_4_;
        auVar17._24_4_ = (uint)((byte)(uVar11 >> 6) & 1) * auVar19._24_4_;
        auVar17._28_4_ = (uint)((byte)(uVar11 >> 7) & 1) * auVar19._28_4_;
        auVar17._32_4_ = (uint)(bVar6 & 1) * auVar19._32_4_;
        auVar17._36_4_ = (uint)(bVar6 >> 1 & 1) * auVar19._36_4_;
        auVar17._40_4_ = (uint)(bVar6 >> 2 & 1) * auVar19._40_4_;
        auVar17._44_4_ = (uint)(bVar6 >> 3 & 1) * auVar19._44_4_;
        auVar17._48_4_ = (uint)(bVar6 >> 4 & 1) * auVar19._48_4_;
        auVar17._52_4_ = (uint)(bVar6 >> 5 & 1) * auVar19._52_4_;
        auVar17._56_4_ = (uint)(bVar6 >> 6 & 1) * auVar19._56_4_;
        auVar17._60_4_ = (uint)(bVar6 >> 7) * auVar19._60_4_;
        pTVar9 = pTVar9 + 0x10;
        uVar4 = vpcmpeqd_avx512f(auVar17,auVar15);
        auVar19 = vpmovm2d_avx512dq(uVar4);
        auVar19 = vpsubd_avx512f(auVar18,auVar19);
      } while (((ulong)((long)pTVar1 + lVar7) / 0x70 + 0x10 & 0xfffffffffffffff0) != uVar10);
      auVar13 = vmovdqa32_avx512f(auVar19);
      auVar14._0_4_ = (uint)(bVar5 & 1) * auVar13._0_4_ | (uint)!(bool)(bVar5 & 1) * auVar18._0_4_;
      bVar8 = (bool)((byte)(uVar11 >> 1) & 1);
      auVar14._4_4_ = (uint)bVar8 * auVar13._4_4_ | (uint)!bVar8 * auVar18._4_4_;
      bVar8 = (bool)((byte)(uVar11 >> 2) & 1);
      auVar14._8_4_ = (uint)bVar8 * auVar13._8_4_ | (uint)!bVar8 * auVar18._8_4_;
      bVar8 = (bool)((byte)(uVar11 >> 3) & 1);
      auVar14._12_4_ = (uint)bVar8 * auVar13._12_4_ | (uint)!bVar8 * auVar18._12_4_;
      bVar8 = (bool)((byte)(uVar11 >> 4) & 1);
      auVar14._16_4_ = (uint)bVar8 * auVar13._16_4_ | (uint)!bVar8 * auVar18._16_4_;
      bVar8 = (bool)((byte)(uVar11 >> 5) & 1);
      auVar14._20_4_ = (uint)bVar8 * auVar13._20_4_ | (uint)!bVar8 * auVar18._20_4_;
      bVar8 = (bool)((byte)(uVar11 >> 6) & 1);
      auVar14._24_4_ = (uint)bVar8 * auVar13._24_4_ | (uint)!bVar8 * auVar18._24_4_;
      bVar8 = (bool)((byte)(uVar11 >> 7) & 1);
      auVar14._28_4_ = (uint)bVar8 * auVar13._28_4_ | (uint)!bVar8 * auVar18._28_4_;
      auVar14._32_4_ =
           (uint)(bVar6 & 1) * auVar13._32_4_ | (uint)!(bool)(bVar6 & 1) * auVar18._32_4_;
      bVar8 = (bool)(bVar6 >> 1 & 1);
      auVar14._36_4_ = (uint)bVar8 * auVar13._36_4_ | (uint)!bVar8 * auVar18._36_4_;
      bVar8 = (bool)(bVar6 >> 2 & 1);
      auVar14._40_4_ = (uint)bVar8 * auVar13._40_4_ | (uint)!bVar8 * auVar18._40_4_;
      bVar8 = (bool)(bVar6 >> 3 & 1);
      auVar14._44_4_ = (uint)bVar8 * auVar13._44_4_ | (uint)!bVar8 * auVar18._44_4_;
      bVar8 = (bool)(bVar6 >> 4 & 1);
      auVar14._48_4_ = (uint)bVar8 * auVar13._48_4_ | (uint)!bVar8 * auVar18._48_4_;
      bVar8 = (bool)(bVar6 >> 5 & 1);
      auVar14._52_4_ = (uint)bVar8 * auVar13._52_4_ | (uint)!bVar8 * auVar18._52_4_;
      bVar8 = (bool)(bVar6 >> 6 & 1);
      auVar14._56_4_ = (uint)bVar8 * auVar13._56_4_ | (uint)!bVar8 * auVar18._56_4_;
      auVar14._60_4_ =
           (uint)(bVar6 >> 7) * auVar13._60_4_ | (uint)!(bool)(bVar6 >> 7) * auVar18._60_4_;
      auVar12 = vextracti64x4_avx512f(auVar14,1);
      auVar13 = vpaddd_avx512f(auVar14,ZEXT3264(auVar12));
      auVar2 = vpaddd_avx(auVar13._0_16_,auVar13._16_16_);
      auVar3 = vpshufd_avx(auVar2,0xee);
      auVar2 = vpaddd_avx(auVar2,auVar3);
      auVar3 = vpshufd_avx(auVar2,0x55);
      auVar2 = vpaddd_avx(auVar2,auVar3);
      return auVar2._0_4_ != 0;
    }
  }
  return false;
}

Assistant:

bool TestResult::Skipped() const {
  return !Failed() && CountIf(test_part_results_, TestPartSkipped) > 0;
}